

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  void *pvVar3;
  ImDrawChannel *pIVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x5de,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = (this->_Channels).Size;
  if (iVar1 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      pIVar4 = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar2 = (this->_Channels).Data;
      if (pIVar2 != (ImDrawChannel *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar4;
      (this->_Channels).Capacity = channels_count;
    }
    iVar10 = (this->_Channels).Capacity;
    if (iVar10 < channels_count) {
      if (iVar10 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar10 / 2 + iVar10;
      }
      if (iVar8 <= channels_count) {
        iVar8 = channels_count;
      }
      if (iVar10 < iVar8) {
        pIVar4 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar8 << 5);
        pIVar2 = (this->_Channels).Data;
        if (pIVar2 != (ImDrawChannel *)0x0) {
          memcpy(pIVar4,pIVar2,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = pIVar4;
        (this->_Channels).Capacity = iVar8;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if (0 < (this->_Channels).Size) {
    *(this->_Channels).Data = (ImDrawChannel)ZEXT1632(ZEXT816(0) << 0x40);
    if (1 < channels_count) {
      uVar11 = 1;
      lVar7 = 0x38;
      do {
        lVar5 = (long)(this->_Channels).Size;
        if ((long)uVar11 < (long)iVar1) {
          if (lVar5 <= (long)uVar11) goto LAB_0018bccd;
          pIVar2 = (this->_Channels).Data;
          iVar10 = *(int *)((long)pIVar2 + lVar7 + -0x14);
          if (iVar10 < 0) {
            uVar9 = iVar10 / 2 + iVar10;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            pvVar6 = ImGui::MemAlloc((ulong)uVar9 * 0x38);
            pvVar3 = *(void **)((long)pIVar2 + lVar7 + -0x10);
            if (pvVar3 != (void *)0x0) {
              memcpy(pvVar6,pvVar3,(long)*(int *)((long)pIVar2 + lVar7 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar2 + lVar7 + -0x10));
            }
            *(void **)((long)pIVar2 + lVar7 + -0x10) = pvVar6;
            *(uint *)((long)pIVar2 + lVar7 + -0x14) = uVar9;
          }
          *(undefined4 *)((long)pIVar2 + lVar7 + -0x18) = 0;
          if ((long)(this->_Channels).Size <= (long)uVar11) goto LAB_0018bccd;
          pIVar2 = (this->_Channels).Data;
          iVar10 = *(int *)((long)pIVar2 + lVar7 + -4);
          if (iVar10 < 0) {
            iVar10 = iVar10 / 2 + iVar10;
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            pvVar6 = ImGui::MemAlloc((ulong)(uint)(iVar10 * 2));
            pvVar3 = *(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7);
            if (pvVar3 != (void *)0x0) {
              memcpy(pvVar6,pvVar3,(long)*(int *)((long)pIVar2 + lVar7 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7));
            }
            *(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar7) = pvVar6;
            *(int *)((long)pIVar2 + lVar7 + -4) = iVar10;
          }
          *(undefined4 *)((long)pIVar2 + lVar7 + -8) = 0;
        }
        else {
          if (lVar5 <= (long)uVar11) goto LAB_0018bccd;
          *(undefined1 (*) [32])((long)(this->_Channels).Data + lVar7 + -0x18) =
               ZEXT1632(ZEXT816(0) << 0x40);
        }
        uVar11 = uVar11 + 1;
        lVar7 = lVar7 + 0x20;
      } while ((uint)channels_count != uVar11);
    }
    return;
  }
LAB_0018bccd:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}